

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_mode(CPState *cp,CPDecl *decl)

{
  uint uVar1;
  GCstr *pGVar2;
  char *pcVar3;
  int local_28;
  int local_24;
  CTSize vlen;
  CTSize sz;
  char *s;
  CPDecl *decl_local;
  CPState *cp_local;
  
  cp_check(cp,0x28);
  if (cp->tok != 0x100) goto LAB_0018d38d;
  pGVar2 = cp->str;
  _vlen = pGVar2 + 1;
  local_28 = 0;
  if (((char)(_vlen->nextgc).gcptr64 == '_') &&
     (*(char *)((long)&pGVar2[1].nextgc.gcptr64 + 1) == '_')) {
    _vlen = (GCstr *)((long)&pGVar2[1].nextgc.gcptr64 + 2);
  }
  pGVar2 = _vlen;
  if ((char)(_vlen->nextgc).gcptr64 == 'V') {
    pGVar2 = (GCstr *)((long)&(_vlen->nextgc).gcptr64 + 2);
    local_28 = *(char *)((long)&(_vlen->nextgc).gcptr64 + 1) + -0x30;
    if (('/' < (char)(pGVar2->nextgc).gcptr64) && ((char)(pGVar2->nextgc).gcptr64 < ':')) {
      local_28 = local_28 * 10 + (char)(pGVar2->nextgc).gcptr64 + -0x30;
      pGVar2 = (GCstr *)((long)&(_vlen->nextgc).gcptr64 + 3);
    }
  }
  _vlen = pGVar2;
  pcVar3 = (char *)((long)&(_vlen->nextgc).gcptr64 + 1);
  switch((char)(_vlen->nextgc).gcptr64) {
  case 'D':
    local_24 = 8;
    break;
  default:
    goto LAB_0018d384;
  case 'H':
    local_24 = 2;
    break;
  case 'O':
    local_24 = 0x20;
    break;
  case 'Q':
    local_24 = 1;
    break;
  case 'S':
    local_24 = 4;
    break;
  case 'T':
    local_24 = 0x10;
  }
  if (((*pcVar3 == 'I') || (*pcVar3 == 'F')) &&
     (decl->attr = decl->attr & 0xffff00ff | local_24 << 8, local_28 != 0)) {
    uVar1 = 0x1f;
    if (local_28 * local_24 != 0) {
      for (; (uint)(local_28 * local_24) >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    decl->attr = decl->attr & 0xffffff0f | (uVar1 & 0xf) << 4;
  }
LAB_0018d384:
  cp_next(cp);
LAB_0018d38d:
  cp_check(cp,0x29);
  return;
}

Assistant:

static void cp_decl_mode(CPState *cp, CPDecl *decl)
{
  cp_check(cp, '(');
  if (cp->tok == CTOK_IDENT) {
    const char *s = strdata(cp->str);
    CTSize sz = 0, vlen = 0;
    if (s[0] == '_' && s[1] == '_') s += 2;
    if (*s == 'V') {
      s++;
      vlen = *s++ - '0';
      if (*s >= '0' && *s <= '9')
	vlen = vlen*10 + (*s++ - '0');
    }
    switch (*s++) {
    case 'Q': sz = 1; break;
    case 'H': sz = 2; break;
    case 'S': sz = 4; break;
    case 'D': sz = 8; break;
    case 'T': sz = 16; break;
    case 'O': sz = 32; break;
    default: goto bad_size;
    }
    if (*s == 'I' || *s == 'F') {
      CTF_INSERT(decl->attr, MSIZEP, sz);
      if (vlen) CTF_INSERT(decl->attr, VSIZEP, lj_fls(vlen*sz));
    }
  bad_size:
    cp_next(cp);
  }
  cp_check(cp, ')');
}